

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.cpp
# Opt level: O0

void __thiscall gui::Widget::addWidgetUnderMouse(Widget *this,Vector2f *param_2)

{
  long in_RDI;
  shared_ptr<gui::Widget> *in_stack_ffffffffffffffd8;
  Gui *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x1d0) != 0) {
    std::enable_shared_from_this<gui::Widget>::shared_from_this
              (*(enable_shared_from_this<gui::Widget> **)(in_RDI + 0x1d0));
    Gui::addWidgetUnderMouse(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::shared_ptr<gui::Widget>::~shared_ptr((shared_ptr<gui::Widget> *)0x22ea2f);
  }
  return;
}

Assistant:

void Widget::addWidgetUnderMouse(const sf::Vector2f& /*mouseParent*/) {
    if (gui_ != nullptr) {
        gui_->addWidgetUnderMouse(shared_from_this());
    }
}